

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetSourcesCommand::HandleDirectContent
          (cmTargetSourcesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  allocator<char> local_71;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  char *local_58 [4];
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SOURCES",&local_71);
  ConvertToAbsoluteContent(&local_70,this,tgt,content,false);
  (*(this->super_cmTargetPropCommandBase).super_cmCommand._vptr_cmCommand[10])
            (local_58,this,&local_70);
  cmTarget::AppendProperty(tgt,&local_38,local_58[0],false);
  std::__cxx11::string::~string((string *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  return true;
}

Assistant:

bool cmTargetSourcesCommand::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool, bool)
{
  tgt->AppendProperty(
    "SOURCES",
    this->Join(ConvertToAbsoluteContent(tgt, content, false)).c_str());
  return true; // Successfully handled.
}